

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoCube>::ClassId(TPZGeoElRefLess<pzgeom::TPZGeoCube> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string *str;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  TPZGeoCube *in_stack_ffffffffffffffa0;
  undefined1 local_29 [41];
  
  str = (string *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  uVar1 = Hash(str);
  iVar2 = TPZGeoEl::ClassId((TPZGeoEl *)0x15e63f6);
  pzgeom::TPZGeoCube::TPZGeoCube((TPZGeoCube *)CONCAT44(uVar1,iVar2));
  iVar3 = pzgeom::TPZGeoCube::ClassId(in_stack_ffffffffffffffa0);
  pzgeom::TPZGeoCube::~TPZGeoCube((TPZGeoCube *)0x15e6443);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}